

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashlin.h
# Opt level: O0

tommy_hashlin_node * tommy_hashlin_bucket(tommy_hashlin *hashlin,tommy_hash_t hash)

{
  long lVar1;
  tommy_hashlin_node **pptVar2;
  long in_FS_OFFSET;
  tommy_hash_t hash_local;
  tommy_hashlin *hashlin_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pptVar2 = tommy_hashlin_bucket_ref(hashlin,hash);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return *pptVar2;
  }
  __stack_chk_fail();
}

Assistant:

tommy_inline tommy_hashlin_node* tommy_hashlin_bucket(tommy_hashlin* hashlin, tommy_hash_t hash)
{
	return *tommy_hashlin_bucket_ref(hashlin, hash);
}